

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecdsa_sign_verify(void)

{
  int iVar1;
  uint64_t uVar2;
  int recid;
  int getrec;
  secp256k1_scalar sigs;
  secp256k1_scalar sigr;
  secp256k1_scalar key;
  secp256k1_scalar msg;
  secp256k1_scalar one;
  secp256k1_ge pub;
  secp256k1_gej pubj;
  uint in_stack_fffffffffffffe4c;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  uint local_1a8;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_scalar *in_stack_fffffffffffffe78;
  secp256k1_scalar *in_stack_fffffffffffffe80;
  secp256k1_scalar *in_stack_fffffffffffffe88;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  secp256k1_scalar *in_stack_ffffffffffffffa0;
  secp256k1_gej *in_stack_ffffffffffffffa8;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffffb0;
  
  testutil_random_scalar_order_test(in_stack_fffffffffffffe70);
  testutil_random_scalar_order_test(in_stack_fffffffffffffe70);
  secp256k1_ecmult_gen
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  secp256k1_ge_set_gej(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  uVar2 = testrand_bits(in_stack_fffffffffffffe4c);
  if ((int)uVar2 == 0) {
    random_sign(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
  }
  else {
    random_sign(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffe57 = local_1a8 < 4;
    if (!(bool)in_stack_fffffffffffffe57) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x187d,"test condition failed: recid >= 0 && recid < 4");
      abort();
    }
  }
  iVar1 = secp256k1_ecdsa_sig_verify
                    ((secp256k1_scalar *)sigr.d[0],(secp256k1_scalar *)sigs.d[3],
                     (secp256k1_ge *)sigs.d[2],(secp256k1_scalar *)sigs.d[1]);
  if (iVar1 != 0) {
    secp256k1_scalar_set_int
              ((secp256k1_scalar *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe4c);
    secp256k1_scalar_add
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    iVar1 = secp256k1_ecdsa_sig_verify
                      ((secp256k1_scalar *)sigr.d[0],(secp256k1_scalar *)sigs.d[3],
                       (secp256k1_ge *)sigs.d[2],(secp256k1_scalar *)sigs.d[1]);
    if (iVar1 != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1884,"test condition failed: !secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)"
             );
      abort();
    }
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1881,"test condition failed: secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg)");
  abort();
}

Assistant:

static void test_ecdsa_sign_verify(void) {
    secp256k1_gej pubj;
    secp256k1_ge pub;
    secp256k1_scalar one;
    secp256k1_scalar msg, key;
    secp256k1_scalar sigr, sigs;
    int getrec;
    int recid;
    testutil_random_scalar_order_test(&msg);
    testutil_random_scalar_order_test(&key);
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &pubj, &key);
    secp256k1_ge_set_gej(&pub, &pubj);
    getrec = testrand_bits(1);
    /* The specific way in which this conditional is written sidesteps a potential bug in clang.
       See the commit messages of the commit that introduced this comment for details. */
    if (getrec) {
        random_sign(&sigr, &sigs, &key, &msg, &recid);
        CHECK(recid >= 0 && recid < 4);
    } else {
        random_sign(&sigr, &sigs, &key, &msg, NULL);
    }
    CHECK(secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));
    secp256k1_scalar_set_int(&one, 1);
    secp256k1_scalar_add(&msg, &msg, &one);
    CHECK(!secp256k1_ecdsa_sig_verify(&sigr, &sigs, &pub, &msg));
}